

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int SUNQRAdd_CGS2(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int in_ECX;
  long in_RSI;
  int in_R8D;
  N_Vector in_R9;
  realtype rVar1;
  SUNQRData qrdata;
  sunindextype j;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  double c;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int iVar2;
  
  N_VScale((realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x1187875);
  if (0 < in_ECX) {
    N_VDotProdMulti(in_stack_ffffffffffffffd4,in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                    (realtype *)in_stack_ffffffffffffffb8);
    N_VLinearCombination
              (in_stack_ffffffffffffffd4,(realtype *)in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_R9,
                 (realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x118790a);
    N_VDotProdMulti(in_stack_ffffffffffffffd4,in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                    (realtype *)in_stack_ffffffffffffffb8);
    N_VLinearCombination
              (in_stack_ffffffffffffffd4,(realtype *)in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_R9,
                 (realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x1187983);
    for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
      *(double *)(in_RSI + (long)(in_ECX * in_R8D + iVar2) * 8) =
           *(double *)(in_RSI + (long)(in_ECX * in_R8D + iVar2) * 8) +
           (double)(&in_R9->sunctx->profiler)[iVar2];
    }
  }
  rVar1 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (0.0 < rVar1) {
    rVar1 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    c = sqrt(rVar1);
  }
  else {
    c = 0.0;
  }
  *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = c;
  N_VScale(c,in_stack_ffffffffffffffb8,(N_Vector)0x1187a94);
  return 0;
}

Assistant:

int SUNQRAdd_CGS2(N_Vector *Q, realtype *R, N_Vector df,
                  int m, int mMax, void *QRdata)
{
    sunindextype j;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* temp = df */

    if (m > 0) {
      /* s_k = Q_k-1^T df_aa -- update with sdata as a realtype* array */
      N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax);

      /* y = df - Q_k-1 s_k */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp2);

      /* z_k = Q_k-1^T y */
      N_VDotProdMulti(m, qrdata->vtemp2, Q, qrdata->temp_array);

      /* df = y - Q_k-1 z_k  -- update using N_VLinearCombination */
      N_VLinearCombination(m, qrdata->temp_array, Q, Q[m]);
      N_VLinearSum(ONE, qrdata->vtemp2, -ONE, Q[m], qrdata->vtemp);

      /* R(1:k-1,k) = s_k + z_k */
      for (j = 0; j < m; j++) {
        R[m * mMax + j] = R[m * mMax + j] + qrdata->temp_array[j];
      }
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / R(k,k) */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}